

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_wally_util.cpp
# Opt level: O0

string * __thiscall
cfd::core::WallyUtil::ConvertStringAndFree_abi_cxx11_
          (string *__return_storage_ptr__,WallyUtil *this,char *wally_string)

{
  exception *except;
  allocator local_1a;
  undefined1 local_19;
  WallyUtil *local_18;
  char *wally_string_local;
  string *result;
  
  local_19 = 0;
  local_18 = this;
  wally_string_local = (char *)__return_storage_ptr__;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(char *)this,&local_1a);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  wally_free_string((char *)local_18);
  return __return_storage_ptr__;
}

Assistant:

std::string WallyUtil::ConvertStringAndFree(char* wally_string) {
  try {
    std::string result = std::string(wally_string);
    wally_free_string(wally_string);
    return result;
  } catch (const std::exception& except) {
    wally_free_string(wally_string);
    warn(CFD_LOG_SOURCE, "system error. except={}.", except.what());
    throw except;
  } catch (...) {
    wally_free_string(wally_string);
    warn(CFD_LOG_SOURCE, "unknown error.");
    throw CfdException();
  }
}